

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::ReplaceNonUniformAccessWithSwitchCase
          (ReplaceDescArrayAccessUsingVarIndex *this,Instruction *access_chain_final_user,
          Instruction *access_chain,uint32_t number_of_elements,
          deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *insts_to_be_cloned)

{
  bool null_const_for_phi_is_needed;
  Instruction *pIVar1;
  IRContext *this_00;
  ReplaceDescArrayAccessUsingVarIndex *this_01;
  uint32_t uVar2;
  uint32_t merge_id;
  BasicBlock *this_02;
  const_iterator cVar3;
  Instruction *separation_begin_inst;
  uint32_t uVar4;
  uint32_t phi_operand;
  Instruction *local_e8;
  uint32_t local_dc;
  BasicBlock *local_d8;
  Function *local_d0;
  ReplaceDescArrayAccessUsingVarIndex *local_c8;
  Instruction *local_c0;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> case_block;
  vector<unsigned_int,_std::allocator<unsigned_int>_> case_block_ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> phi_operands;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  default_block;
  __node_base_ptr p_Stack_38;
  
  local_dc = number_of_elements;
  local_c0 = access_chain;
  local_d8 = IRContext::get_instr_block((this->super_Pass).context_,access_chain_final_user);
  if (local_d8 != (BasicBlock *)0x0) {
    pIVar1 = (access_chain_final_user->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
             next_node_;
    uVar4 = 0;
    separation_begin_inst = (Instruction *)0x0;
    if ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
      separation_begin_inst = pIVar1;
    }
    local_e8 = access_chain_final_user;
    local_c8 = this;
    this_02 = SeparateInstructionsIntoNewBlock(this,local_d8,separation_begin_inst);
    local_d0 = local_d8->function_;
    phi_operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    phi_operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    phi_operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    case_block_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    case_block_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    case_block_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (; pIVar1 = local_e8, local_dc != uVar4; uVar4 = uVar4 + 1) {
      default_block._M_t.
      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
           (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
            )&p_Stack_38;
      p_Stack_38 = (__node_base_ptr)0x0;
      uVar2 = BasicBlock::id(this_02);
      case_block._M_t.
      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
           (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
            )CreateCaseBlock(local_c8,local_c0,uVar4,insts_to_be_cloned,uVar2,
                             (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              *)&default_block);
      phi_operand = BasicBlock::id((BasicBlock *)
                                   case_block._M_t.
                                   super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                                   .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>.
                                   _M_head_impl);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&case_block_ids,&phi_operand);
      Function::InsertBasicBlockBefore(local_d0,&case_block,this_02);
      if (local_e8->has_result_id_ == true) {
        phi_operand = Instruction::result_id(local_e8);
        cVar3 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)&default_block,&phi_operand);
        if (cVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          __assert_fail("itr != map.end() && \"Key does not exist\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp"
                        ,0x22,
                        "uint32_t spvtools::opt::(anonymous namespace)::GetValueWithKeyExistenceCheck(uint32_t, const std::unordered_map<uint32_t, uint32_t> &)"
                       );
        }
        phi_operand = *(uint32_t *)
                       ((long)cVar3.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                              ._M_cur + 0xc);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&phi_operands,&phi_operand);
      }
      std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
      ~unique_ptr(&case_block);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&default_block);
    }
    null_const_for_phi_is_needed = local_e8->has_result_id_;
    uVar4 = BasicBlock::id(this_02);
    this_01 = local_c8;
    default_block._M_t.
    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
          )CreateDefaultBlock(local_c8,null_const_for_phi_is_needed,&phi_operands,uVar4);
    uVar4 = BasicBlock::id((BasicBlock *)
                           default_block._M_t.
                           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
    Function::InsertBasicBlockBefore(local_d0,&default_block,this_02);
    uVar2 = descsroautil::GetFirstIndexOfAccessChain(local_c0);
    merge_id = BasicBlock::id(this_02);
    AddSwitchForAccessChain(this_01,local_d8,uVar2,uVar4,merge_id,&case_block_ids);
    if (phi_operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        phi_operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar4 = CreatePhiInstruction(this_01,this_02,&phi_operands,&case_block_ids,uVar4);
      this_00 = (this_01->super_Pass).context_;
      uVar2 = Instruction::result_id(pIVar1);
      IRContext::ReplaceAllUsesWith(this_00,uVar2,uVar4);
    }
    uVar4 = BasicBlock::id(local_d8);
    uVar2 = BasicBlock::id(this_02);
    ReplacePhiIncomingBlock(this_01,uVar4,uVar2);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr(&default_block);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&case_block_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&phi_operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::ReplaceNonUniformAccessWithSwitchCase(
    Instruction* access_chain_final_user, Instruction* access_chain,
    uint32_t number_of_elements,
    const std::deque<Instruction*>& insts_to_be_cloned) const {
  auto* block = context()->get_instr_block(access_chain_final_user);
  // If the instruction does not belong to a block (i.e. in the case of
  // OpDecorate), no replacement is needed.
  if (!block) return;

  // Create merge block and add terminator
  auto* merge_block = SeparateInstructionsIntoNewBlock(
      block, access_chain_final_user->NextNode());

  auto* function = block->GetParent();

  // Add case blocks
  std::vector<uint32_t> phi_operands;
  std::vector<uint32_t> case_block_ids;
  for (uint32_t idx = 0; idx < number_of_elements; ++idx) {
    std::unordered_map<uint32_t, uint32_t> old_ids_to_new_ids_for_cloned_insts;
    std::unique_ptr<BasicBlock> case_block(CreateCaseBlock(
        access_chain, idx, insts_to_be_cloned, merge_block->id(),
        &old_ids_to_new_ids_for_cloned_insts));
    case_block_ids.push_back(case_block->id());
    function->InsertBasicBlockBefore(std::move(case_block), merge_block);

    // Keep the operand for OpPhi
    if (!access_chain_final_user->HasResultId()) continue;
    uint32_t phi_operand =
        GetValueWithKeyExistenceCheck(access_chain_final_user->result_id(),
                                      old_ids_to_new_ids_for_cloned_insts);
    phi_operands.push_back(phi_operand);
  }

  // Create default block
  std::unique_ptr<BasicBlock> default_block(
      CreateDefaultBlock(access_chain_final_user->HasResultId(), &phi_operands,
                         merge_block->id()));
  uint32_t default_block_id = default_block->id();
  function->InsertBasicBlockBefore(std::move(default_block), merge_block);

  // Create OpSwitch
  uint32_t access_chain_index_var_id =
      descsroautil::GetFirstIndexOfAccessChain(access_chain);
  AddSwitchForAccessChain(block, access_chain_index_var_id, default_block_id,
                          merge_block->id(), case_block_ids);

  // Create phi instructions
  if (!phi_operands.empty()) {
    uint32_t phi_id = CreatePhiInstruction(merge_block, phi_operands,
                                           case_block_ids, default_block_id);
    context()->ReplaceAllUsesWith(access_chain_final_user->result_id(), phi_id);
  }

  // Replace OpPhi incoming block operand that uses |block| with |merge_block|
  ReplacePhiIncomingBlock(block->id(), merge_block->id());
}